

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rollback_state.cpp
# Opt level: O2

void __thiscall
duckdb::RollbackState::RollbackEntry(RollbackState *this,UndoFlags type,data_ptr_t data)

{
  CatalogEntry *entry;
  CatalogSet *this_00;
  DeleteInfo *info;
  
  switch(type) {
  case CATALOG_ENTRY:
    entry = *(CatalogEntry **)data;
    this_00 = optional_ptr<duckdb::CatalogSet,_true>::operator->(&entry->set);
    CatalogSet::Undo(this_00,entry);
    return;
  case INSERT_TUPLE:
    DataTable::RevertAppend
              (*(DataTable **)data,this->transaction,*(idx_t *)(data + 8),*(idx_t *)(data + 0x10));
    return;
  case DELETE_TUPLE:
    RowVersionManager::CommitDelete
              (*(RowVersionManager **)(data + 8),*(idx_t *)(data + 0x10),0xfffffffffffffffe,
               (DeleteInfo *)data);
    return;
  case UPDATE_TUPLE:
    UpdateSegment::RollbackUpdate(*(UpdateSegment **)data,(UpdateInfo *)data);
    return;
  default:
    return;
  }
}

Assistant:

void RollbackState::RollbackEntry(UndoFlags type, data_ptr_t data) {
	switch (type) {
	case UndoFlags::CATALOG_ENTRY: {
		// Load and undo the catalog entry.
		auto catalog_entry = Load<CatalogEntry *>(data);
		D_ASSERT(catalog_entry->set);
		catalog_entry->set->Undo(*catalog_entry);
		break;
	}
	case UndoFlags::INSERT_TUPLE: {
		auto info = reinterpret_cast<AppendInfo *>(data);
		// revert the append in the base table
		info->table->RevertAppend(transaction, info->start_row, info->count);
		break;
	}
	case UndoFlags::DELETE_TUPLE: {
		auto info = reinterpret_cast<DeleteInfo *>(data);
		// reset the deleted flag on rollback
		info->version_info->CommitDelete(info->vector_idx, NOT_DELETED_ID, *info);
		break;
	}
	case UndoFlags::UPDATE_TUPLE: {
		auto info = reinterpret_cast<UpdateInfo *>(data);
		info->segment->RollbackUpdate(*info);
		break;
	}
	case UndoFlags::SEQUENCE_VALUE:
		break;
	default: // LCOV_EXCL_START
		D_ASSERT(type == UndoFlags::EMPTY_ENTRY);
		break;
	} // LCOV_EXCL_STOP
}